

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::removeDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __position;
  handle dlock;
  BaseType local_34;
  handle local_30;
  
  local_34 = fedID.gid;
  TimeDependencies::removeDependency(&(this->super_BaseTimeCoordinator).dependencies,fedID);
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::lock(&local_30,&this->dependency_federates);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<helics::GlobalFederateId*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,__gnu_cxx::__ops::_Iter_equals_val<helics::GlobalFederateId_const>>
                         (((local_30.data)->
                          super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          ((local_30.data)->
                          super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          )._M_impl.super__Vector_impl_data._M_finish,&local_34);
  if (__position._M_current !=
      ((local_30.data)->
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::erase
              (local_30.data,(const_iterator)__position._M_current);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  return;
}

Assistant:

void TimeCoordinator::removeDependency(GlobalFederateId fedID)
{
    dependencies.removeDependency(fedID);
    // remove the thread safe version
    auto dlock = dependency_federates.lock();
    auto res = std::find(dlock.begin(), dlock.end(), fedID);
    if (res != dlock.end()) {
        dlock->erase(res);
    }
}